

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O1

void set_term_code(char *buf,quarter quarter,unsigned_short year)

{
  if (quarter < 4) {
    sprintf(buf,"%02u%c",(ulong)((uint)year + ((year >> 2) / 0x19) * -100 & 0xffff),
            (ulong)*(uint *)(&DAT_0010a390 + (ulong)quarter * 4));
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BradleyCai[P]libucrcourse/src/params.c"
                ,0x25,"void set_term_code(char *, enum quarter, unsigned short)");
}

Assistant:

static void set_term_code(char *buf, enum quarter quarter, unsigned short year)
{
	char quarter_letter;

	switch (quarter) {
	case FALL_QUARTER:
		quarter_letter = 'F';
		break;
	case WINTER_QUARTER:
		quarter_letter = 'W';
		break;
	case SPRING_QUARTER:
		quarter_letter = 'S';
		break;
	case SUMMER_QUARTER:
		quarter_letter = 'U';
		break;
	default:
		assert(0);
	}

	sprintf(buf, "%02u%c", year % 100u, quarter_letter);
}